

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tree.cpp
# Opt level: O2

int main(void)

{
  _Head_base<0UL,_TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_*,_false> _Var1;
  _Head_base<0UL,_TBT::SequenceNode<Body_&>_*,_false> __p_00;
  pointer __p;
  __single_object peelRightArm;
  __single_object rootNode;
  __single_object peelLeftArm;
  BehaviorTree<Body_&> tree;
  Body body;
  _Head_base<0UL,_TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_*,_false> local_88
  ;
  __uniq_ptr_impl<PrintArmNode,_std::default_delete<PrintArmNode>_> local_80;
  _Head_base<0UL,_TBT::SequenceNode<Body_&>_*,_false> local_78;
  _Head_base<0UL,_TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_*,_false> local_70
  ;
  _Head_base<0UL,_TBT::BehaviorNode<Body_&>_*,_false> local_68;
  _Head_base<0UL,_PrintArmNode_*,_false> local_60;
  Body local_58;
  
  Body::Body(&local_58);
  local_68._M_head_impl = (BehaviorNode<Body_&> *)0x0;
  std::make_unique<TBT::SequenceNode<Body&>>();
  std::make_unique<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>>();
  _Var1._M_head_impl = local_70._M_head_impl;
  std::make_unique<PrintArmNode>();
  local_88._M_head_impl =
       (PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)
       local_80._M_t.super__Tuple_impl<0UL,_PrintArmNode_*,_std::default_delete<PrintArmNode>_>.
       super__Head_base<0UL,_PrintArmNode_*,_false>._M_head_impl;
  local_80._M_t.super__Tuple_impl<0UL,_PrintArmNode_*,_std::default_delete<PrintArmNode>_>.
  super__Head_base<0UL,_PrintArmNode_*,_false>._M_head_impl =
       (tuple<PrintArmNode_*,_std::default_delete<PrintArmNode>_>)
       (_Tuple_impl<0UL,_PrintArmNode_*,_std::default_delete<PrintArmNode>_>)0x0;
  TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>::setChild
            (_Var1._M_head_impl,
             (unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>
              *)&local_88);
  std::unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>
               *)&local_88);
  std::unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_>::~unique_ptr
            ((unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_> *)&local_80);
  local_88._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)0x0;
  TBT::SequenceNode<Body_&>::addChild
            (local_78._M_head_impl,
             (unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
              *)&local_88);
  std::unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
               *)&local_88);
  std::make_unique<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body&>,Arm&>>();
  _Var1._M_head_impl = local_88._M_head_impl;
  std::make_unique<PrintArmNode>();
  local_80._M_t.super__Tuple_impl<0UL,_PrintArmNode_*,_std::default_delete<PrintArmNode>_>.
  super__Head_base<0UL,_PrintArmNode_*,_false>._M_head_impl =
       (tuple<PrintArmNode_*,_std::default_delete<PrintArmNode>_>)
       (tuple<PrintArmNode_*,_std::default_delete<PrintArmNode>_>)local_60._M_head_impl;
  local_60._M_head_impl = (PrintArmNode *)0x0;
  TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>::setChild
            ((PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)_Var1._M_head_impl,
             (unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>
              *)&local_80);
  std::unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::BehaviorNode<Arm_&>,_std::default_delete<TBT::BehaviorNode<Arm_&>_>_>
               *)&local_80);
  std::unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_>::~unique_ptr
            ((unique_ptr<PrintArmNode,_std::default_delete<PrintArmNode>_> *)&local_60);
  local_80._M_t.super__Tuple_impl<0UL,_PrintArmNode_*,_std::default_delete<PrintArmNode>_>.
  super__Head_base<0UL,_PrintArmNode_*,_false>._M_head_impl =
       (tuple<PrintArmNode_*,_std::default_delete<PrintArmNode>_>)
       (tuple<PrintArmNode_*,_std::default_delete<PrintArmNode>_>)local_88._M_head_impl;
  local_88._M_head_impl = (PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)0x0;
  TBT::SequenceNode<Body_&>::addChild
            (local_78._M_head_impl,
             (unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
              *)&local_80);
  std::unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
               *)&local_80);
  __p_00._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SequenceNode<Body_&> *)0x0;
  local_80._M_t.super__Tuple_impl<0UL,_PrintArmNode_*,_std::default_delete<PrintArmNode>_>.
  super__Head_base<0UL,_PrintArmNode_*,_false>._M_head_impl =
       (tuple<PrintArmNode_*,_std::default_delete<PrintArmNode>_>)
       (_Tuple_impl<0UL,_PrintArmNode_*,_std::default_delete<PrintArmNode>_>)0x0;
  std::__uniq_ptr_impl<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
  ::reset((__uniq_ptr_impl<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
           *)&local_68,&(__p_00._M_head_impl)->super_BehaviorNode<Body_&>);
  std::unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
               *)&local_80);
  if (local_68._M_head_impl != (BehaviorNode<Body_&> *)0x0) {
    (**(local_68._M_head_impl)->_vptr_BehaviorNode)(local_68._M_head_impl,&local_58);
  }
  std::
  unique_ptr<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
  ::~unique_ptr((unique_ptr<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
                 *)&local_88);
  std::
  unique_ptr<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
  ::~unique_ptr((unique_ptr<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>,_std::default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>_>
                 *)&local_70);
  std::unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::SequenceNode<Body_&>,_std::default_delete<TBT::SequenceNode<Body_&>_>_>
               *)&local_78);
  std::unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>::
  ~unique_ptr((unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
               *)&local_68);
  Body::~Body(&local_58);
  return 0;
}

Assistant:

int main()
{
    Body body;


    BehaviorTree<Body&> tree;

    auto rootNode = std::make_unique<SequenceNode<Body&>>();
    auto peelLeftArm = std::make_unique<PeelLeftArm>();
    peelLeftArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelLeftArm));
    auto peelRightArm = std::make_unique<PeelRightArm>();
    peelRightArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelRightArm));

    tree.setRoot(std::move(rootNode));

    tree.tickRoot(body);

    return 0;
}